

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O0

bool __thiscall HighsLp::equalScaling(HighsLp *this,HighsLp *lp)

{
  pointer pdVar1;
  bool bVar2;
  bool bVar3;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  bool equal;
  bool local_21;
  
  local_21 = (*(byte *)((long)&in_RDI[0x15].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4) & 1) ==
             (*(byte *)(in_RSI + 0x20c) & 1) &&
             *(int *)&in_RDI[0x15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage == *(int *)(in_RSI + 0x208);
  bVar2 = false;
  if (*(int *)&in_RDI[0x16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start == *(int *)(in_RSI + 0x210)) {
    bVar2 = local_21;
  }
  bVar3 = false;
  if (*(int *)((long)&in_RDI[0x16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + 4) == *(int *)(in_RSI + 0x214)) {
    bVar3 = bVar2;
  }
  pdVar1 = in_RDI[0x16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = false;
  if (((double)pdVar1 == *(double *)(in_RSI + 0x218)) &&
     (!NAN((double)pdVar1) && !NAN(*(double *)(in_RSI + 0x218)))) {
    bVar2 = bVar3;
  }
  bVar3 = std::operator==(unaff_retaddr,in_RDI);
  if (!bVar3) {
    bVar2 = false;
  }
  bVar3 = std::operator==(unaff_retaddr,in_RDI);
  if (!bVar3) {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool HighsLp::equalScaling(const HighsLp& lp) const {
  bool equal = true;
  equal = this->scale_.strategy == lp.scale_.strategy && equal;
  equal = this->scale_.has_scaling == lp.scale_.has_scaling && equal;
  equal = this->scale_.num_col == lp.scale_.num_col && equal;
  equal = this->scale_.num_row == lp.scale_.num_row && equal;
  equal = this->scale_.cost == lp.scale_.cost && equal;
  equal = this->scale_.col == lp.scale_.col && equal;
  equal = this->scale_.row == lp.scale_.row && equal;
#ifndef NDEBUG
  if (!equal) printf("HighsLp::equalScaling: Unequal scaling\n");
#endif
  return equal;
}